

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

void __thiscall
Lib::CombinationIterator<unsigned_int>::CombinationIterator
          (CombinationIterator<unsigned_int> *this,uint from,uint to)

{
  uint uVar1;
  
  this->_first = from;
  this->_second = from;
  this->_afterLast = to;
  if (from != to) {
    if (from + 1 != to) {
      uVar1 = this->_second + 1;
      this->_second = uVar1;
      if (uVar1 == this->_afterLast) {
        uVar1 = this->_first;
        this->_first = uVar1 + 1;
        this->_second = uVar1 + 2;
      }
      return;
    }
    this->_second = to;
  }
  return;
}

Assistant:

CombinationIterator(T from, T to)
  : _first(from), _second(from), _afterLast(to)
  {
    ASS_LE(from,to);
    if(from!=to) {
      if(from+1==to) {
	_second=_afterLast;
      } else {
	moveToNext();
      }
    }
  }